

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluator.cpp
# Opt level: O0

int __thiscall despot::Planner::RunEvaluation(Planner *this,int argc,char **argv)

{
  Belief *pBVar1;
  World *pWVar2;
  DSPOMDP *main_clock_start_00;
  Option *options_00;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Belief *pBVar4;
  Solver *solver_00;
  string *world_type_00;
  undefined4 uVar5;
  string local_1a8 [36];
  undefined4 local_184;
  undefined1 local_180 [4];
  int start_run;
  string local_160;
  Logger *local_140;
  Logger *logger;
  Solver *local_118;
  Solver *solver;
  Belief *local_f0;
  Belief *belief;
  World *world;
  DSPOMDP *model;
  clock_t main_clock_start;
  Option *local_c8;
  Option *options;
  int time_limit;
  string belief_type;
  allocator<char> local_81;
  undefined1 local_80 [8];
  string world_type;
  int num_runs;
  bool search_solver;
  string solver_type;
  char **argv_local;
  int argc_local;
  Planner *this_local;
  undefined4 extraout_var_02;
  
  solver_type.field_2._8_8_ = argv;
  (*(this->super_PlannerBase)._vptr_PlannerBase[5])(&num_runs);
  world_type.field_2._8_4_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_80,"pomdp",&local_81);
  std::allocator<char>::~allocator(&local_81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&time_limit,"DEFAULT",(allocator<char> *)((long)&options + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&options + 7));
  options._0_4_ = -1;
  local_c8 = PlannerBase::InitializeParamers
                       (&this->super_PlannerBase,argc,(char **)solver_type.field_2._8_8_,
                        (string *)&num_runs,(bool *)(world_type.field_2._M_local_buf + 0xf),
                        (int *)(world_type.field_2._M_local_buf + 8),(string *)local_80,
                        (string *)&time_limit,(int *)&options);
  if (local_c8 != (Option *)0x0) {
    model = (DSPOMDP *)clock();
    iVar3 = (*(this->super_PlannerBase)._vptr_PlannerBase[2])(this,local_c8);
    world = (World *)CONCAT44(extraout_var,iVar3);
    if (world == (World *)0x0) {
      __assert_fail("model != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/evaluator.cpp"
                    ,0x4d,"virtual int despot::Planner::RunEvaluation(int, char **)");
    }
    iVar3 = (*(this->super_PlannerBase)._vptr_PlannerBase[3])(this,local_80,world,local_c8);
    pWVar2 = world;
    belief = (Belief *)CONCAT44(extraout_var_00,iVar3);
    if (belief == (Belief *)0x0) {
      __assert_fail("world != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/evaluator.cpp"
                    ,0x53,"virtual int despot::Planner::RunEvaluation(int, char **)");
    }
    iVar3 = (*belief->_vptr_Belief[4])();
    std::__cxx11::string::string((string *)&solver,(string *)&time_limit);
    iVar3 = (*pWVar2->_vptr_World[9])(pWVar2,CONCAT44(extraout_var_01,iVar3),&solver);
    pBVar4 = (Belief *)CONCAT44(extraout_var_02,iVar3);
    std::__cxx11::string::~string((string *)&solver);
    pWVar2 = world;
    local_f0 = pBVar4;
    if (pBVar4 == (Belief *)0x0) {
      __assert_fail("belief != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/evaluator.cpp"
                    ,0x59,"virtual int despot::Planner::RunEvaluation(int, char **)");
    }
    std::__cxx11::string::string((string *)&logger,(string *)&num_runs);
    solver_00 = PlannerBase::InitializeSolver
                          (&this->super_PlannerBase,(DSPOMDP *)pWVar2,pBVar4,(string *)&logger,
                           local_c8);
    std::__cxx11::string::~string((string *)&logger);
    uVar5 = world_type.field_2._8_4_;
    options_00 = local_c8;
    main_clock_start_00 = model;
    pWVar2 = world;
    pBVar1 = belief;
    pBVar4 = local_f0;
    local_140 = (Logger *)0x0;
    local_118 = solver_00;
    std::__cxx11::string::string((string *)&local_160,(string *)local_80);
    iVar3 = (int)options;
    std::__cxx11::string::string((string *)local_180,(string *)&num_runs);
    world_type_00 = &local_160;
    PlannerBase::InitializeLogger
              (&this->super_PlannerBase,&local_140,options_00,(DSPOMDP *)pWVar2,pBVar4,solver_00,
               uVar5,(clock_t)main_clock_start_00,(World *)pBVar1,world_type_00,iVar3,
               (string *)local_180);
    uVar5 = (undefined4)((ulong)world_type_00 >> 0x20);
    std::__cxx11::string::~string((string *)local_180);
    std::__cxx11::string::~string((string *)&local_160);
    local_184 = 0;
    PlannerBase::DisplayParameters(&this->super_PlannerBase,local_c8,(DSPOMDP *)world);
    pWVar2 = world;
    pBVar1 = belief;
    pBVar4 = local_f0;
    std::__cxx11::string::string(local_1a8,(string *)&time_limit);
    (*(this->super_PlannerBase)._vptr_PlannerBase[10])
              (this,pWVar2,pBVar1,pBVar4,local_1a8,&local_118,local_140,local_c8,model,
               CONCAT44(uVar5,world_type.field_2._8_4_),local_184);
    std::__cxx11::string::~string(local_1a8);
    PlannerBase::PrintResult
              (&this->super_PlannerBase,world_type.field_2._8_4_,local_140,(clock_t)model);
  }
  main_clock_start._4_4_ = 1;
  std::__cxx11::string::~string((string *)&time_limit);
  std::__cxx11::string::~string((string *)local_80);
  std::__cxx11::string::~string((string *)&num_runs);
  return 0;
}

Assistant:

int Planner::RunEvaluation(int argc, char *argv[]) {

	/* =========================
	 * initialize parameters
	 * =========================*/
	string solver_type = ChooseSolver();
	bool search_solver;
	int num_runs = 1;
	string world_type = "pomdp";
	string belief_type = "DEFAULT";
	int time_limit = -1;

	option::Option *options = InitializeParamers(argc, argv, solver_type,
			search_solver, num_runs, world_type, belief_type, time_limit);
	if(options==NULL)
		return 0;
	clock_t main_clock_start = clock();

	/* =========================
	 * initialize model
	 * =========================*/
	DSPOMDP *model = InitializeModel(options);
	assert(model != NULL);

	/* =========================
	 * initialize world
	 * =========================*/
	World *world = InitializeWorld(world_type, model, options);
	assert(world != NULL);

	/* =========================
	 * initialize belief
	 * =========================*/
	Belief* belief = model->InitialBelief(world->GetCurrentState(), belief_type);
	assert(belief != NULL);

	/* =========================
	 * initialize solver
	 * =========================*/
	Solver *solver = InitializeSolver(model, belief, solver_type, options);

	/* =========================
	 * initialize logger
	 * =========================*/
	Logger *logger = NULL;
	InitializeLogger(logger, options, model, belief, solver, num_runs,
			main_clock_start, world, world_type, time_limit, solver_type);
	//logger->world_seed(world_seed);

	int start_run = 0;

	/* =========================
	 * Display parameters
	 * =========================*/
	DisplayParameters(options, model);

	/* =========================
	 * run evaluation
	 * =========================*/
	EvaluationLoop(model, world, belief, belief_type, solver, logger,
			options, main_clock_start, num_runs, start_run);

	//logger->End();

	PrintResult(num_runs, logger, main_clock_start);

	return 0;
}